

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void google::protobuf::internal::SwapFieldHelper::SwapNonInlinedStrings<false>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  ArenaStringPtr *lhs_00;
  ArenaStringPtr *rhs_00;
  Arena *rhs_arena;
  Arena *lhs_arena;
  
  lhs_00 = Reflection::MutableRaw<google::protobuf::internal::ArenaStringPtr>(r,lhs,field);
  rhs_00 = Reflection::MutableRaw<google::protobuf::internal::ArenaStringPtr>(r,rhs,field);
  lhs_arena = (Arena *)(lhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)lhs_arena & 1) != 0) {
    lhs_arena = *(Arena **)((ulong)lhs_arena & 0xfffffffffffffffe);
  }
  rhs_arena = (Arena *)(rhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)rhs_arena & 1) != 0) {
    rhs_arena = *(Arena **)((ulong)rhs_arena & 0xfffffffffffffffe);
  }
  SwapArenaStringPtr(lhs_00,lhs_arena,rhs_00,rhs_arena);
  return;
}

Assistant:

void SwapFieldHelper::SwapNonInlinedStrings(const Reflection* r, Message* lhs,
                                            Message* rhs,
                                            const FieldDescriptor* field) {
  ArenaStringPtr* lhs_string = r->MutableRaw<ArenaStringPtr>(lhs, field);
  ArenaStringPtr* rhs_string = r->MutableRaw<ArenaStringPtr>(rhs, field);
  if (unsafe_shallow_swap) {
    ArenaStringPtr::UnsafeShallowSwap(lhs_string, rhs_string);
  } else {
    SwapFieldHelper::SwapArenaStringPtr(lhs_string, lhs->GetArena(),  //
                                        rhs_string, rhs->GetArena());
  }
}